

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  uint uVar5;
  ImU32 IVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  GetterYRef *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawIdx IVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pIVar13 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  uVar5 = *(uint *)((long)pGVar7->Ys +
                   (long)(((prim + pGVar7->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride)
  ;
  dVar21 = log10((pGVar7->XScale * (double)prim + pGVar7->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar9 = pIVar13->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  fVar17 = (float)((((double)(float)(dVar21 / pIVar13->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar4].Min.x);
  fVar18 = (float)(((double)uVar5 - pIVar9->YAxis[iVar4].Range.Min) * pIVar13->My[iVar4] +
                  (double)pIVar13->PixelRange[iVar4].Min.y);
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  dVar2 = pGVar10->YRef;
  dVar22 = log10(((double)prim * pGVar10->XScale + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar14->CurrentPlot;
  dVar21 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  fVar23 = (float)((((double)(float)(dVar22 / pIVar14->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar21) + dVar21) - dVar21) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar4].Min.x);
  fVar24 = (float)((dVar2 - pIVar9->YAxis[iVar4].Range.Min) * pIVar14->My[iVar4] +
                  (double)pIVar14->PixelRange[iVar4].Min.y);
  fVar19 = fVar18;
  if (fVar24 <= fVar18) {
    fVar19 = fVar24;
  }
  bVar16 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(~-(uint)(fVar24 <= fVar18) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar18) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar17;
    if (fVar23 <= fVar17) {
      fVar19 = fVar23;
    }
    bVar16 = false;
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar23 <= fVar17) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar17) & (uint)fVar17);
      bVar16 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar19 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar25 = fVar23 - fVar17;
    fVar26 = fVar24 - fVar18;
    fVar20 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar25 = fVar25 * (1.0 / fVar20);
      fVar26 = fVar26 * (1.0 / fVar20);
    }
    fVar19 = fVar19 * 0.5;
    fVar25 = fVar25 * fVar19;
    fVar19 = fVar19 * fVar26;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar19 + fVar17;
    (pIVar11->pos).y = fVar18 - fVar25;
    pIVar11->uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar19 + fVar23;
    pIVar11[1].pos.y = fVar24 - fVar25;
    pIVar11[1].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar23 - fVar19;
    pIVar11[2].pos.y = fVar25 + fVar24;
    pIVar11[2].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar17 - fVar19;
    pIVar11[3].pos.y = fVar25 + fVar18;
    pIVar11[3].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar5;
    *pIVar12 = IVar15;
    pIVar12[1] = IVar15 + 1;
    pIVar12[2] = IVar15 + 2;
    pIVar12[3] = IVar15;
    pIVar12[4] = IVar15 + 2;
    pIVar12[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }